

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

aom_fixed_buf_t * av1_get_global_headers(AV1_PRIMARY *ppi)

{
  uint32_t uVar1;
  int iVar2;
  size_t available;
  aom_fixed_buf_t *__ptr;
  void *__dest;
  ulong value;
  ulong __size;
  size_t coded_size_field_size;
  uint8_t header_buf [512];
  size_t local_240;
  uint8_t local_238;
  uint8_t local_237 [519];
  
  if (ppi != (AV1_PRIMARY *)0x0) {
    memset(&local_238,0,0x200);
    uVar1 = av1_write_sequence_header_obu(&ppi->seq_params,&local_238,0x200);
    if (uVar1 == 0) {
      return (aom_fixed_buf_t *)0x0;
    }
    value = (ulong)uVar1;
    available = aom_uleb_size_in_bytes(value);
    __size = available + value + 1;
    if (__size < 0x201) {
      memmove(local_237 + available,&local_238,value);
      uVar1 = av1_write_obu_header
                        (&ppi->level_params,&ppi->cpi->frame_header_count,OBU_SEQUENCE_HEADER,
                         (ppi->seq_params).has_nonzero_operating_point_idc,false,0,&local_238);
      if (uVar1 != 1) {
        return (aom_fixed_buf_t *)0x0;
      }
      local_240 = 0;
      iVar2 = aom_uleb_encode(value,available,local_237,&local_240);
      if ((iVar2 == 0) && (__ptr = (aom_fixed_buf_t *)malloc(0x10), __ptr != (aom_fixed_buf_t *)0x0)
         ) {
        __dest = malloc(__size);
        __ptr->buf = __dest;
        if (__dest != (void *)0x0) {
          memcpy(__dest,&local_238,__size);
          __ptr->sz = __size;
          return __ptr;
        }
        free(__ptr);
      }
    }
  }
  return (aom_fixed_buf_t *)0x0;
}

Assistant:

aom_fixed_buf_t *av1_get_global_headers(AV1_PRIMARY *ppi) {
  if (!ppi) return NULL;

  uint8_t header_buf[512] = { 0 };
  const uint32_t sequence_header_size = av1_write_sequence_header_obu(
      &ppi->seq_params, &header_buf[0], sizeof(header_buf));
  assert(sequence_header_size <= sizeof(header_buf));
  if (sequence_header_size == 0) return NULL;

  const size_t obu_header_size = 1;
  const size_t size_field_size = aom_uleb_size_in_bytes(sequence_header_size);
  const size_t payload_offset = obu_header_size + size_field_size;

  if (payload_offset + sequence_header_size > sizeof(header_buf)) return NULL;
  memmove(&header_buf[payload_offset], &header_buf[0], sequence_header_size);

  if (av1_write_obu_header(&ppi->level_params, &ppi->cpi->frame_header_count,
                           OBU_SEQUENCE_HEADER,
                           ppi->seq_params.has_nonzero_operating_point_idc,
                           /*is_layer_specific_obu=*/false, 0,
                           &header_buf[0]) != obu_header_size) {
    return NULL;
  }

  size_t coded_size_field_size = 0;
  if (aom_uleb_encode(sequence_header_size, size_field_size,
                      &header_buf[obu_header_size],
                      &coded_size_field_size) != 0) {
    return NULL;
  }
  assert(coded_size_field_size == size_field_size);

  aom_fixed_buf_t *global_headers =
      (aom_fixed_buf_t *)malloc(sizeof(*global_headers));
  if (!global_headers) return NULL;

  const size_t global_header_buf_size =
      obu_header_size + size_field_size + sequence_header_size;

  global_headers->buf = malloc(global_header_buf_size);
  if (!global_headers->buf) {
    free(global_headers);
    return NULL;
  }

  memcpy(global_headers->buf, &header_buf[0], global_header_buf_size);
  global_headers->sz = global_header_buf_size;
  return global_headers;
}